

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

bool __thiscall
TypeFactory::setFields
          (TypeFactory *this,vector<TypeField,_std::allocator<TypeField>_> *fd,TypeStruct *ot,
          int4 fixedsize)

{
  int iVar1;
  pointer pTVar2;
  pointer pTVar3;
  long lVar4;
  bool bVar5;
  LowlevelError *this_00;
  ulong uVar6;
  pointer pTVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  DatatypeSet *this_01;
  bool bVar12;
  pair<std::_Rb_tree_iterator<Datatype_*>,_std::_Rb_tree_iterator<Datatype_*>_> pVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar12 = pTVar2 == pTVar3;
  if (bVar12) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    pTVar7 = pTVar2;
    do {
      if ((pTVar7->type->metatype == TYPE_VOID) || ((pTVar7->name)._M_string_length == 0)) {
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if ((pTVar7->offset != -1) &&
           (uVar8 = pTVar7->offset + pTVar7->type->size, (int)uVar11 < (int)uVar8)) {
          uVar11 = uVar8;
        }
      }
      if (!bVar5) {
        return bVar12;
      }
      pTVar7 = pTVar7 + 1;
      bVar12 = pTVar7 == pTVar3;
    } while (!bVar12);
  }
  if (pTVar2 != pTVar3) {
    uVar8 = this->align;
    pTVar7 = pTVar2;
    do {
      if (pTVar7->offset == -1) {
        uVar9 = 0;
        iVar1 = pTVar7->type->size;
        uVar10 = uVar8;
        if (1 < (int)uVar8) {
          do {
            uVar9 = uVar10;
            uVar10 = uVar9 >> 1;
          } while (iVar1 <= (int)uVar10);
          uVar9 = uVar9 - 1;
        }
        uVar10 = ((uVar11 + uVar9) - (uVar9 & uVar11)) + 1;
        if ((uVar9 & uVar11) == 0) {
          uVar10 = uVar11;
        }
        pTVar7->offset = uVar10;
        uVar11 = uVar10 + iVar1;
      }
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != pTVar3);
  }
  if (pTVar2 != pTVar3) {
    uVar6 = ((long)pTVar3 - (long)pTVar2 >> 4) * -0x5555555555555555;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<TypeField*,std::vector<TypeField,std::allocator<TypeField>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pTVar2,pTVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<TypeField*,std::vector<TypeField,std::allocator<TypeField>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pTVar2,pTVar3);
  }
  this_01 = &this->tree;
  local_50._M_dataplus._M_p = (pointer)ot;
  pVar13 = std::
           _Rb_tree<Datatype_*,_Datatype_*,_std::_Identity<Datatype_*>,_DatatypeCompare,_std::allocator<Datatype_*>_>
           ::equal_range(&this_01->_M_t,(key_type *)&local_50);
  std::
  _Rb_tree<Datatype_*,_Datatype_*,_std::_Identity<Datatype_*>,_DatatypeCompare,_std::allocator<Datatype_*>_>
  ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
  TypeStruct::setFields(ot,fd);
  if (0 < fixedsize) {
    iVar1 = (ot->super_Datatype).size;
    if (iVar1 < fixedsize) {
      (ot->super_Datatype).size = fixedsize;
    }
    else if (fixedsize < iVar1) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::operator+(&local_50,"Trying to force too small a size on ",&(ot->super_Datatype).name);
      LowlevelError::LowlevelError(this_00,&local_50);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  local_50._M_dataplus._M_p = (pointer)ot;
  std::
  _Rb_tree<Datatype*,Datatype*,std::_Identity<Datatype*>,DatatypeCompare,std::allocator<Datatype*>>
  ::_M_insert_unique<Datatype*>
            ((_Rb_tree<Datatype*,Datatype*,std::_Identity<Datatype*>,DatatypeCompare,std::allocator<Datatype*>>
              *)this_01,(Datatype **)&local_50);
  return bVar12;
}

Assistant:

bool TypeFactory::setFields(vector<TypeField> &fd,TypeStruct *ot,int4 fixedsize)

{
  int4 offset,cursize,curalign;

  offset = 0;
  vector<TypeField>::iterator iter;

  // Find the maximum offset, from the explicitly set offsets
  for(iter=fd.begin();iter!=fd.end();++iter) {
    Datatype *ct = (*iter).type;
    // Do some sanity checks on the field
    if (ct->getMetatype() == TYPE_VOID) return false;
    if ((*iter).name.size() == 0) return false;

    if ((*iter).offset != -1) {
      int4 end = (*iter).offset + ct->getSize();
      if (end > offset)
	offset = end;
    }
  }

  // Assign offsets, respecting alignment, where not explicitly set
  for(iter=fd.begin();iter!=fd.end();++iter) {
    if ((*iter).offset != -1) continue;
    cursize = (*iter).type->getSize();
    curalign = 0;
    if (align > 1) {
      curalign = align;
      while((curalign>>1) >= cursize)
	curalign >>= 1;
      curalign -= 1;
    }
    if ((offset & curalign)!=0)
      offset = (offset-(offset & curalign) + (curalign+1));
    (*iter).offset = offset;
    offset += cursize;
  }

  sort(fd.begin(),fd.end());	// Sort fields by offset

  // We could check field overlapping here

  tree.erase(ot);
  ot->setFields(fd);
  if (fixedsize > 0) {		// If the caller is trying to force a size
    if (fixedsize > ot->size)	// If the forced size is bigger than the size required for fields
      ot->size = fixedsize;	//     Force the bigger size
    else if (fixedsize < ot->size) // If the forced size is smaller, this is an error
      throw LowlevelError("Trying to force too small a size on "+ot->getName());
  }
  tree.insert(ot);
  return true;
}